

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

iter_type __thiscall
booster::locale::impl_icu::num_parse<char>::do_real_get<unsigned_short>
          (num_parse<char> *this,iter_type in,iter_type end,ios_base *ios,iostate *err,
          unsigned_short *val)

{
  iter_type iVar1;
  long *plVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  streambuf_type *psVar8;
  ulong uVar9;
  uint uVar10;
  iter_type __beg;
  iter_type iVar11;
  iter_type iVar12;
  cast_type value;
  long *local_60;
  long *local_58;
  string_type tmp;
  
  iVar11._M_sbuf = end._M_sbuf;
  psVar8 = in._M_sbuf;
  uVar10 = in._M_c;
  local_58 = (long *)__dynamic_cast(ios,&std::ios_base::typeinfo,&std::istream::typeinfo,
                                    0xffffffffffffffff);
  iVar6 = end._M_c;
  if ((local_58 != (long *)0x0) && (bVar3 = num_base::use_parent<unsigned_short>(ios,0), !bVar3)) {
    formatter<char>::create((formatter<char> *)&tmp,ios,&this->loc_,&this->enc_);
    local_60 = (long *)tmp._M_dataplus._M_p;
    if (tmp._M_dataplus._M_p != (pointer)0x0) {
      tmp._M_string_length = 0;
      tmp.field_2._M_local_buf[0] = '\0';
      tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
      std::__cxx11::string::reserve((ulong)&tmp);
LAB_0018aca3:
      uVar4 = uVar10;
      if (uVar10 == 0xffffffff && psVar8 != (streambuf_type *)0x0) {
        if (*(byte **)(psVar8 + 0x10) < *(byte **)(psVar8 + 0x18)) {
          uVar4 = (uint)**(byte **)(psVar8 + 0x10);
        }
        else {
          uVar4 = (**(code **)(*(long *)psVar8 + 0x48))(psVar8);
          if (uVar4 == 0xffffffff) {
            psVar8 = (streambuf_type *)0x0;
          }
        }
      }
      if (iVar11._M_sbuf == (streambuf_type *)0x0 || iVar6 != -1) {
        if ((iVar6 == -1) == (uVar4 == 0xffffffff)) goto LAB_0018af38;
      }
      else if ((*(ulong *)(iVar11._M_sbuf + 0x10) < *(ulong *)(iVar11._M_sbuf + 0x18)) ||
              (iVar5 = (**(code **)(*(long *)iVar11._M_sbuf + 0x48))(iVar11._M_sbuf), iVar5 != -1))
      {
        if (uVar4 != 0xffffffff) goto LAB_0018af38;
      }
      else {
        iVar11._M_sbuf = (streambuf_type *)0x0;
        if (uVar4 == 0xffffffff) goto LAB_0018af38;
      }
      uVar4 = uVar10;
      if (psVar8 != (streambuf_type *)0x0 && uVar10 == 0xffffffff) {
        if (*(byte **)(psVar8 + 0x10) < *(byte **)(psVar8 + 0x18)) {
          uVar4 = (uint)**(byte **)(psVar8 + 0x10);
        }
        else {
          uVar4 = (**(code **)(*(long *)psVar8 + 0x48))(psVar8);
          if (uVar4 == 0xffffffff) {
            psVar8 = (streambuf_type *)0x0;
          }
        }
      }
      if ((char)uVar4 != '\x7f' && 0x1f < (byte)((char)uVar4 - 1U)) goto LAB_0018af38;
      if (*(ulong *)(psVar8 + 0x10) < *(ulong *)(psVar8 + 0x18)) {
        *(ulong *)(psVar8 + 0x10) = *(ulong *)(psVar8 + 0x10) + 1;
        uVar10 = 0xffffffff;
      }
      else {
        uVar10 = 0xffffffff;
        (**(code **)(*(long *)psVar8 + 0x50))(psVar8);
      }
      goto LAB_0018aca3;
    }
  }
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)SUB128(in._0_12_,0);
  __beg._M_c = SUB124(in._0_12_,8);
  iVar11._8_8_ = end._8_8_ & 0xffffffff;
  iVar11 = std::num_get<char,std::istreambuf_iterator<char,std::char_traits<char>>>::
           _M_extract_int_abi_cxx11_<unsigned_short>
                     ((num_get<char,std::istreambuf_iterator<char,std::char_traits<char>>> *)this,
                      __beg,iVar11,ios,err,val);
  iVar12._M_sbuf = iVar11._M_sbuf;
  iVar12._M_c = iVar11._M_c;
  iVar12._12_4_ = iVar11._12_4_;
  return iVar12;
LAB_0018af38:
  if (0xfff < tmp._M_string_length) goto LAB_0018af47;
  uVar4 = uVar10;
  if (uVar10 == 0xffffffff && psVar8 != (streambuf_type *)0x0) {
    if (*(byte **)(psVar8 + 0x10) < *(byte **)(psVar8 + 0x18)) {
      uVar4 = (uint)**(byte **)(psVar8 + 0x10);
    }
    else {
      uVar4 = (**(code **)(*(long *)psVar8 + 0x48))(psVar8);
      if (uVar4 == 0xffffffff) {
        psVar8 = (streambuf_type *)0x0;
      }
    }
  }
  if (iVar11._M_sbuf == (streambuf_type *)0x0 || iVar6 != -1) {
    if ((iVar6 == -1) == (uVar4 == 0xffffffff)) goto LAB_0018af47;
  }
  else if ((*(ulong *)(iVar11._M_sbuf + 0x10) < *(ulong *)(iVar11._M_sbuf + 0x18)) ||
          (iVar5 = (**(code **)(*(long *)iVar11._M_sbuf + 0x48))(iVar11._M_sbuf), iVar5 != -1)) {
    if (uVar4 != 0xffffffff) goto LAB_0018af47;
  }
  else {
    iVar11._M_sbuf = (streambuf_type *)0x0;
    if (uVar4 == 0xffffffff) goto LAB_0018af47;
  }
  if (psVar8 == (streambuf_type *)0x0 || uVar10 != 0xffffffff) {
LAB_0018ae72:
    if ((char)uVar10 == '\n') goto LAB_0018af47;
  }
  else {
    if (*(byte **)(psVar8 + 0x10) < *(byte **)(psVar8 + 0x18)) {
      uVar10 = (uint)**(byte **)(psVar8 + 0x10);
      goto LAB_0018ae72;
    }
    uVar10 = (**(code **)(*(long *)psVar8 + 0x48))(psVar8);
    if (uVar10 != 0xffffffff) goto LAB_0018ae72;
    psVar8 = (streambuf_type *)0x0;
  }
  if (*(ulong *)(psVar8 + 0x10) < *(ulong *)(psVar8 + 0x18)) {
    *(ulong *)(psVar8 + 0x10) = *(ulong *)(psVar8 + 0x10) + 1;
  }
  else {
    iVar5 = (**(code **)(*(long *)psVar8 + 0x50))(psVar8);
    if ((iVar5 == -1) && (*(ulong *)(psVar8 + 0x18) <= *(ulong *)(psVar8 + 0x10))) {
      (**(code **)(*(long *)psVar8 + 0x48))(psVar8);
    }
  }
  uVar10 = 0xffffffff;
  std::__cxx11::string::push_back((char)&tmp);
  goto LAB_0018af38;
LAB_0018af47:
  plVar2 = local_60;
  uVar7 = (**(code **)(*local_60 + 0x38))(local_60,&tmp,&value);
  uVar9 = tmp._M_string_length;
  if ((uVar7 == 0) || (0xffff < (uint)value)) {
    *(undefined1 *)err = (char)*err | _S_failbit;
  }
  else {
    *val = (unsigned_short)value;
  }
  for (; uVar7 < uVar9; uVar9 = uVar9 - 1) {
    std::istream::putback((char)local_58);
  }
  psVar8 = *(streambuf_type **)((long)local_58 + *(long *)(*local_58 + -0x18) + 0xe8);
  if (psVar8 == (streambuf_type *)0x0) {
    bVar3 = true;
    psVar8 = (streambuf_type *)0x0;
  }
  else if (*(ulong *)(psVar8 + 0x10) < *(ulong *)(psVar8 + 0x18)) {
    bVar3 = false;
  }
  else {
    iVar5 = (**(code **)(*(long *)psVar8 + 0x48))(psVar8);
    bVar3 = iVar5 == -1;
    if (bVar3) {
      psVar8 = (streambuf_type *)0x0;
    }
  }
  if (iVar11._M_sbuf == (streambuf_type *)0x0 || iVar6 != -1) {
    if ((iVar6 != -1) == bVar3) goto LAB_0018b045;
  }
  else if (*(ulong *)(iVar11._M_sbuf + 0x10) < *(ulong *)(iVar11._M_sbuf + 0x18)) {
    if (bVar3 != false) goto LAB_0018b045;
  }
  else {
    iVar6 = (**(code **)(*(long *)iVar11._M_sbuf + 0x48))(iVar11._M_sbuf);
    if (bVar3 != (iVar6 == -1)) goto LAB_0018b045;
  }
  *(undefined1 *)err = (char)*err | _S_eofbit;
LAB_0018b045:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tmp._M_dataplus._M_p != &tmp.field_2) {
    operator_delete(tmp._M_dataplus._M_p);
  }
  (**(code **)(*plVar2 + 8))(plVar2);
  iVar1._8_8_ = 0xffffffff;
  iVar1._M_sbuf = psVar8;
  return iVar1;
}

Assistant:

iter_type do_real_get(iter_type in,iter_type end,std::ios_base &ios,std::ios_base::iostate &err,ValueType &val) const
    {
        formatter_ptr formatter;
        stream_type *stream_ptr = dynamic_cast<stream_type *>(&ios);

        if(!stream_ptr || use_parent<ValueType>(ios,0) || (formatter = formatter_type::create(ios,loc_,enc_)).get()==0) {
            return std::num_get<CharType>::do_get(in,end,ios,err,val);
        }

        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type tmp;
        tmp.reserve(64);

        CharType c;
        while(in!=end && (((c=*in)<=32 && (c>0)) || c==127)) // Assuming that ASCII is a subset
            ++in;

        while(tmp.size() < 4096 && in!=end && *in!='\n') {
            tmp += *in++;
        }

        cast_type value;
        size_t parsed_chars;

        if((parsed_chars = formatter->parse(tmp,value))==0 || !valid<ValueType>(value)) {
            err |= std::ios_base::failbit;
        }
        else {
            val=static_cast<ValueType>(value);
        }

        for(size_t n=tmp.size();n>parsed_chars;n--) {
            stream_ptr->putback(tmp[n-1]);
        }

        in = iter_type(*stream_ptr);

        if(in==end)
            err |=std::ios_base::eofbit;
        return in;
    }